

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

string * __thiscall
LinearSystem::SwapMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream local_1a8 [7];
  bool started;
  ostringstream out;
  allocator<char> local_19;
  SwapMatrix *local_18;
  SwapMatrix *this_local;
  
  local_18 = this;
  this_local = (SwapMatrix *)__return_storage_ptr__;
  bVar1 = IsEmpty(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    bVar1 = this->first_row_ != this->second_row_;
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)local_1a8,"Swap rows: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->first_row_);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<(poVar2,this->second_row_);
    }
    if (this->first_main_column_ != this->second_main_column_) {
      if (bVar1) {
        std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = true;
      poVar2 = std::operator<<((ostream *)local_1a8,"Swap column: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->first_main_column_);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<(poVar2,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar1) {
        std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
      }
      poVar2 = std::operator<<((ostream *)local_1a8,"Swap column: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->first_extension_column_);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<(poVar2,this->second_extension_column_);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToString() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  if (first_row_ != second_row_) {
    started = true;
    out << "Swap rows: " << first_row_  << " " << second_row_;
  }
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << std::endl;
    }
    started = true;
    out << "Swap column: " << first_main_column_ << " " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << std::endl;
    }
    out << "Swap column: " << first_extension_column_ << " " << second_extension_column_;
  }

  return out.str();
}